

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

double __thiscall asl::Log::log(Log *this,double __x)

{
  bool bVar1;
  pthread_mutex_t *__mutex;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Long LVar6;
  anon_union_16_2_78e7fdac_for_String_2 *paVar7;
  String *in_RCX;
  uint in_EDX;
  String *in_RSI;
  char *pcVar8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar9;
  String line;
  undefined1 local_110 [72];
  String oldfile;
  String logfile;
  String catg;
  Date now;
  String local_78;
  String local_60;
  String local_48;
  
  updateState(this);
  dVar9 = extraout_XMM0_Qa;
  if ((int)in_EDX <= this->_maxLevel) {
    Date::now();
    iVar4 = String::lastIndexOf(in_RSI,'\\');
    iVar5 = String::lastIndexOf(in_RSI,'/');
    if (iVar5 < iVar4) {
      iVar5 = iVar4;
    }
    iVar4 = 0;
    if (-1 < iVar5) {
      iVar4 = iVar5 + 1;
    }
    iVar5 = String::lastIndexOf(in_RSI,'.');
    if (iVar5 < 0) {
      iVar5 = in_RSI->_len;
    }
    String::substring(&catg,in_RSI,iVar4,iVar5);
    bVar1 = this->_useconsole;
    __mutex = (pthread_mutex_t *)this->_mutex;
    pthread_mutex_lock(__mutex);
    String::String(&logfile,&this->_logfile);
    if (this->_usefile == true) {
      File::File((File *)local_110,&logfile);
      LVar6 = File::size((File *)local_110);
      File::~File((File *)local_110);
      if (1000000 < LVar6) {
        Path::Path((Path *)&line,&logfile);
        Path::noExt((Path *)&local_60,(Path *)&line);
        Path::operator+((Path *)&local_48,(Path *)&local_60,"-1.");
        Path::extension(&local_78,(Path *)&line);
        Path::operator+((Path *)local_110,(Path *)&local_48,&local_78);
        String::String(&oldfile,(String *)local_110);
        String::~String((String *)local_110);
        String::~String(&local_78);
        String::~String(&local_48);
        String::~String(&local_60);
        File::File((File *)local_110,&oldfile);
        bVar2 = File::exists((File *)local_110);
        File::~File((File *)local_110);
        if (bVar2) {
          Directory::remove((char *)&oldfile);
        }
        Directory::move(&logfile,&oldfile);
        String::~String(&oldfile);
        String::~String(&line);
      }
    }
    pcVar8 = "";
    if ((in_EDX < 5) && ((0x1bU >> (in_EDX & 0x1f) & 1) != 0)) {
      pcVar8 = (&PTR_anon_var_dwarf_87ded_00154c28)[in_EDX];
      bVar2 = true;
      if (bVar1 != false) {
        Console::color((Console *)&console,*(Color *)(&DAT_00142160 + (ulong)in_EDX * 4));
      }
    }
    else {
      bVar2 = false;
    }
    Date::toString((String *)local_110,&now,LONG);
    if (local_110._0_4_ == 0) {
      local_110._8_8_ = local_110 + 8;
    }
    if (catg._size == 0) {
      catg.field_2._str = (char *)&catg.field_2;
    }
    if (in_RCX->_size == 0) {
      paVar7 = &in_RCX->field_2;
    }
    else {
      paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)(in_RCX->field_2)._str;
    }
    String::String(&line,0,"[%s][%s] %s%s\n",local_110._8_8_,catg.field_2._str,pcVar8,paVar7);
    String::~String((String *)local_110);
    bVar3 = String::endsWith(in_RCX,'\n');
    if (bVar3) {
      String::resize(&line,line._len + -1,true,true);
    }
    if (this->_usefile == true) {
      File::File((File *)local_110,&this->_logfile);
      TextFile::append((TextFile *)local_110,&line);
      File::~File((File *)local_110);
    }
    if ((bVar1 != false) && (printf("%s"), bVar2)) {
      Console::color((Console *)&console,COLOR_DEFAULT);
    }
    String::~String(&line);
    String::~String(&logfile);
    pthread_mutex_unlock(__mutex);
    String::~String(&catg);
    dVar9 = extraout_XMM0_Qa_00;
  }
  return dVar9;
}

Assistant:

void Log::log(const String& cat, Log::Level level, const String& message)
{
	updateState();
	if (level > _maxLevel)
		return;

	Date now = Date::now();

	// remove directory and extension, so __FILE__ can be used as category
	int slash = max(cat.lastIndexOf('\\'), cat.lastIndexOf('/'));
	int i0 = (slash<0) ? 0 : slash + 1;
	int dot = cat.lastIndexOf('.');
	int i1 = (dot<0) ? cat.length() : dot;
	String catg = cat.substring(i0, i1);
	bool useconsole = _useconsole;

	Lock lock(*_mutex);

#ifndef __ANDROID_API__
	String logfile = _logfile;
	if (_usefile && TextFile(logfile).size() > ASL_LOG_MAX_SIZE)
	{
		Path   path = logfile;
		String oldfile = path.noExt() + "-1." + path.extension();
		if (File(oldfile).exists())
			Directory::remove(oldfile);
		Directory::move(logfile, oldfile);
	}
#endif

	const char* slevel = "";
	Console::Color color = Console::COLOR_DEFAULT;

	switch (level)
	{
	case Log::WARNING:
		slevel = "WARNING: ";
		color = Console::BYELLOW;
		break;
	case Log::ERR:
		slevel = "ERROR: ";
		color = Console::BRED;
		break;
	case Log::DEBUG:
		color = Console::GREEN;
		break;
	case Log::VERBOSE:
		color = Console::CYAN;
		break;
	default:
		break;
	}

	if (useconsole && color != Console::COLOR_DEFAULT)
		console.color(color);

	String line(0, "[%s][%s] %s%s\n", *now.toString(), *catg, slevel, *message);

	if (message.endsWith('\n'))
		line.resize(line.length() - 1);

	if (_usefile)
		TextFile(_logfile).append(line);

	if (useconsole)
	{
		printf("%s", *line);
		if (color != Console::COLOR_DEFAULT)
			console.color();
	}
}